

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrLib.h
# Opt level: O0

void __thiscall nv::String::allocString(String *this,char *str,int len)

{
  char *str_00;
  char *ptr;
  int len_local;
  char *str_local;
  String *this_local;
  
  str_00 = (char *)mem::malloc((long)(len + 3));
  setData(this,str_00);
  setRefCount(this,0);
  strCpy(this->data,len + 1,str,len);
  this->data[len] = '\0';
  return;
}

Assistant:

void allocString(const char * str, int len)
		{
			const char * ptr = static_cast<const char *>(mem::malloc(2 + len + 1));
	
			setData( ptr );				
			setRefCount( 0 );
			
			// Copy string.
			strCpy(const_cast<char *>(data), len+1, str, len);

			// Add terminating character.
			const_cast<char *>(data)[len] = '\0';
		}